

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O3

void diy::
     reduce<void(*)(void*,diy::ReduceProxy_const&,SortPartners_const&),SortPartners,SkipHistogram>
               (Master *master,Assigner *assigner,SortPartners *partners,
               _func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr **reduce,SkipHistogram *skip)

{
  SortPartners *pSVar1;
  pointer ppVar2;
  int iVar3;
  mapped_type *this;
  mapped_type *this_00;
  int iVar4;
  int round;
  RegularPartners *pRVar5;
  uint uVar6;
  ulong uVar7;
  vector<int,_std::allocator<int>_> incoming_gids;
  _Any_data local_328;
  code *local_318;
  code *pcStack_310;
  int local_308;
  int local_304;
  _Any_data local_300;
  code *local_2f0;
  code *local_2e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2e0;
  SkipHistogram *local_2d8;
  _func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr **local_2d0;
  Assigner *local_2c8;
  ulong local_2c0;
  RegularPartners *local_2b8;
  RegularPartners *local_2b0;
  long local_2a8;
  SortPartners *local_2a0;
  int *local_298;
  IncomingRoundMap *local_290;
  _Any_data local_288;
  code *local_278;
  code *local_270;
  _Any_data local_268;
  code *local_258;
  code *local_250;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  ReductionFunctor<void,_SortPartners> local_228;
  
  local_2d8 = skip;
  local_2d0 = reduce;
  local_2c8 = assigner;
  local_2e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  local_2e0->_M_use_count = 1;
  local_2e0->_M_weak_count = 1;
  local_2e0->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0014e198;
  local_308 = master->expected_;
  if ((partners->rounds_).
      super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (partners->rounds_).
      super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
  }
  else {
    local_2b8 = &(partners->histogram).super_RegularPartners;
    local_2b0 = &(partners->exchange).super_RegularPartners;
    local_290 = &master->incoming_;
    local_298 = &master->exchange_round_;
    uVar7 = 0;
    local_2a0 = partners;
    do {
      local_318 = (code *)0x0;
      pcStack_310 = (code *)0x0;
      local_328._M_unused._M_object = (_func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr *)0x0;
      local_328._8_8_ = 0;
      if (*local_2d0 != (_func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr *)0x0) {
        pcStack_310 = std::
                      _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)>
                      ::_M_invoke;
        local_318 = std::
                    _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)>
                    ::_M_manager;
        local_328._M_unused._0_8_ = (undefined8)*local_2d0;
      }
      iVar4 = (int)uVar7;
      detail::ReductionFunctor<void,_SortPartners>::ReductionFunctor
                (&local_228,iVar4,(Callback *)&local_328,partners,local_2c8);
      pSVar1 = local_2d8->partners;
      local_300._8_8_ = 0;
      local_300._M_unused._M_object = operator_new(0x18);
      *(int *)local_300._M_unused._0_8_ = iVar4;
      *(SortPartners **)((long)local_300._M_unused._0_8_ + 8) = partners;
      *(SortPartners **)((long)local_300._M_unused._0_8_ + 0x10) = pSVar1;
      local_2e8 = std::
                  _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<SortPartners,_SkipHistogram>_>
                  ::_M_invoke;
      local_2f0 = std::
                  _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<SortPartners,_SkipHistogram>_>
                  ::_M_manager;
      Master::foreach<diy::detail::ReductionFunctor<void,SortPartners>>
                (master,&local_228,(Skip *)&local_300);
      if (local_2f0 != (code *)0x0) {
        (*local_2f0)(&local_300,&local_300,__destroy_functor);
      }
      SortPartners::~SortPartners(&local_228.partners);
      if (local_228.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_228.reduce.super__Function_base._M_manager)
                  ((_Any_data *)&local_228.reduce,(_Any_data *)&local_228.reduce,__destroy_functor);
      }
      if (local_318 != (code *)0x0) {
        (*local_318)(&local_328,&local_328,__destroy_functor);
      }
      Master::execute(master);
      local_2c0 = uVar7;
      if ((int)((ulong)((long)(master->blocks_).elements_.
                              super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(master->blocks_).elements_.
                             super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3) == 0) {
        iVar4 = 0;
      }
      else {
        iVar3 = iVar4 + 1;
        local_2a8 = (long)iVar4;
        uVar6 = 0;
        iVar4 = 0;
        local_304 = iVar3;
        do {
          local_228._0_8_ = (pointer)0x0;
          local_228.reduce.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
          local_228.reduce.super__Function_base._M_functor._8_8_ = 0;
          ppVar2 = (local_2a0->rounds_).
                   super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (local_304 ==
              (int)((ulong)((long)(local_2a0->rounds_).
                                  super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) >> 3))
          {
            round = ppVar2[local_2a8].second;
            pRVar5 = local_2b0;
          }
          else {
            pRVar5 = local_2b8;
            if (ppVar2[iVar3].first == true) {
              round = ppVar2[local_2a8].second;
            }
            else if (ppVar2[iVar3].second == 0 && (uint)local_2c0 < 0x7fffffff) {
              round = ppVar2[local_2c0].second;
              pRVar5 = local_2b0;
            }
            else {
              round = ppVar2[iVar3].second + -1;
            }
          }
          RegularPartners::fill
                    (pRVar5,round,
                     (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)uVar6],
                     (vector<int,_std::allocator<int>_> *)&local_228);
          uVar7 = (long)local_228.reduce.super__Function_base._M_functor._M_unused._0_8_ -
                  local_228._0_8_;
          local_328._0_4_ =
               (master->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(int)uVar6];
          this = std::
                 map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
                 ::operator[](local_290,local_298);
          this_00 = std::
                    map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
                    ::operator[](&this->map,(key_type *)local_328._M_pod_data);
          concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
          ::clear(this_00);
          if ((pointer)local_228._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_228._0_8_,
                            local_228.reduce.super__Function_base._M_functor._8_8_ - local_228._0_8_
                           );
          }
          iVar4 = iVar4 + (int)(uVar7 >> 2);
          uVar6 = uVar6 + 1;
        } while (uVar6 < (uint)((ulong)((long)(master->blocks_).elements_.
                                              super__Vector_base<void_*,_std::allocator<void_*>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)(master->blocks_).elements_.
                                             super__Vector_base<void_*,_std::allocator<void_*>_>.
                                             _M_impl.super__Vector_impl_data._M_start) >> 3));
      }
      master->expected_ = iVar4;
      local_288._M_unused._M_object = (void *)0x0;
      local_288._8_8_ = 0;
      local_270 = std::
                  _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                  ::_M_invoke;
      local_278 = std::
                  _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
                  ::_M_manager;
      local_268._M_unused._M_object = (void *)0x0;
      local_268._8_8_ = 0;
      local_250 = std::
                  _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                  ::_M_invoke;
      local_258 = std::
                  _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
                  ::_M_manager;
      local_248._M_unused._M_object = (void *)0x0;
      local_248._8_8_ = 0;
      local_230 = std::
                  _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                  ::_M_invoke;
      local_238 = std::
                  _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
                  ::_M_manager;
      Master::flush(master,false,(MemoryManagement *)&local_288);
      partners = local_2a0;
      uVar7 = local_2c0;
      if (local_238 != (code *)0x0) {
        (*local_238)(&local_248,&local_248,__destroy_functor);
      }
      if (local_258 != (code *)0x0) {
        (*local_258)(&local_268,&local_268,__destroy_functor);
      }
      if (local_278 != (code *)0x0) {
        (*local_278)(&local_288,&local_288,__destroy_functor);
      }
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
    } while (uVar7 < (ulong)((long)(partners->rounds_).
                                   super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(partners->rounds_).
                                   super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_318 = (code *)0x0;
  pcStack_310 = (code *)0x0;
  local_328._M_unused._M_object = (_func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr *)0x0;
  local_328._8_8_ = 0;
  if (*local_2d0 != (_func_void_void_ptr_ReduceProxy_ptr_SortPartners_ptr *)0x0) {
    pcStack_310 = std::
                  _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)>
                  ::_M_invoke;
    local_318 = std::
                _Function_handler<void_(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&),_void_(*)(void_*,_const_diy::ReduceProxy_&,_const_SortPartners_&)>
                ::_M_manager;
    local_328._M_unused._0_8_ = (undefined8)*local_2d0;
  }
  detail::ReductionFunctor<void,_SortPartners>::ReductionFunctor
            (&local_228,uVar6,(Callback *)&local_328,partners,local_2c8);
  pSVar1 = local_2d8->partners;
  local_300._8_8_ = 0;
  local_300._M_unused._M_object = operator_new(0x18);
  *(uint *)local_300._M_unused._0_8_ = uVar6;
  *(SortPartners **)((long)local_300._M_unused._0_8_ + 8) = partners;
  *(SortPartners **)((long)local_300._M_unused._0_8_ + 0x10) = pSVar1;
  local_2e8 = std::
              _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<SortPartners,_SkipHistogram>_>
              ::_M_invoke;
  local_2f0 = std::
              _Function_handler<bool_(int,_const_diy::Master_&),_diy::detail::SkipInactiveOr<SortPartners,_SkipHistogram>_>
              ::_M_manager;
  Master::foreach<diy::detail::ReductionFunctor<void,SortPartners>>
            (master,&local_228,(Skip *)&local_300);
  if (local_2f0 != (code *)0x0) {
    (*local_2f0)(&local_300,&local_300,__destroy_functor);
  }
  SortPartners::~SortPartners(&local_228.partners);
  if (local_228.reduce.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_228.reduce.super__Function_base._M_manager)
              ((_Any_data *)&local_228.reduce,(_Any_data *)&local_228.reduce,__destroy_functor);
  }
  if (local_318 != (code *)0x0) {
    (*local_318)(&local_328,&local_328,__destroy_functor);
  }
  master->expected_ = local_308;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2e0);
  return;
}

Assistant:

void reduce(Master&                    master,        //!< master object
            const Assigner&            assigner,      //!< assigner object
            const Partners&            partners,      //!< partners object
            const Reduce&              reduce,        //!< reduction callback function
            const Skip&                skip)          //!< object determining whether a block should be skipped
{
  auto log = get_logger();

  int original_expected = master.expected();

  using Block = typename detail::block_traits<Reduce>::type;

  unsigned round;
  for (round = 0; round < partners.rounds(); ++round)
  {
    log->debug("Round {}", round);
    master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                   detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));
    master.execute();

    int expected = 0;
    for (unsigned i = 0; i < master.size(); ++i)
    {
      if (partners.active(round + 1, master.gid(i), master))
      {
        std::vector<int> incoming_gids;
        partners.incoming(round + 1, master.gid(i), incoming_gids, master);
        expected += static_cast<int>(incoming_gids.size());
        master.incoming(master.gid(i)).clear();
      }
    }
    master.set_expected(expected);
    master.flush(false);
  }
  // final round
  log->debug("Round {}", round);
  master.foreach(detail::ReductionFunctor<Block,Partners>(round, reduce, partners, assigner),
                 detail::SkipInactiveOr<Partners,Skip>(round, partners, skip));

  master.set_expected(original_expected);
}